

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::MergeFrom
          (RepeatedField<unsigned_int> *this,RepeatedField<unsigned_int> *other)

{
  int index;
  LogMessage *pLVar1;
  uint *__dest;
  uint *__src;
  LogFinisher local_91;
  LogMessage local_90;
  LogMessage local_58;
  
  if (other == this) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2f1);
    pLVar1 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (other->current_size_ != 0) {
    index = this->current_size_;
    Reserve(this,other->current_size_ + index);
    AddNAlreadyReserved(this,other->current_size_);
    __dest = Mutable(this,index);
    if (other->current_size_ < 1) {
      internal::LogMessage::LogMessage
                (&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x280);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_90,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=(&local_91,pLVar1);
      internal::LogMessage::~LogMessage(&local_90);
    }
    __src = elements(other);
    memcpy(__dest,__src,(long)other->current_size_ << 2);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::MergeFrom(const RepeatedField& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ != 0) {
    int existing_size = size();
    Reserve(existing_size + other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(existing_size), &other.Get(0), other.size());
  }
}